

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string cur_dir_1;
  size_type next_pos;
  undefined1 local_78 [8];
  string next_dir;
  string cur_dir;
  size_type pos;
  bool fresh_local;
  char *suffix_local;
  size_type start_pos_local;
  string *dir_local;
  cmFindLibraryCommand *this_local;
  
  lVar2 = std::__cxx11::string::find((char *)dir,0x91a0ee);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)(&next_dir.field_2._M_allocated_capacity + 1),(ulong)dir);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (&next_dir.field_2._M_allocated_capacity + 1),suffix);
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_78);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&next_pos,(ulong)dir);
      std::__cxx11::string::operator+=((string *)local_78,(string *)&next_pos);
      std::__cxx11::string::~string((string *)&next_pos);
      sVar3 = strlen(suffix);
      cur_dir_1.field_2._8_8_ = lVar2 + 4 + sVar3;
      AddArchitecturePath(this,(string *)local_78,cur_dir_1.field_2._8_8_,suffix,true);
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&next_dir.field_2 + 8));
    if (bVar1) {
      AddArchitecturePath(this,dir,lVar2 + 4,suffix,false);
    }
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)(next_dir.field_2._M_local_buf + 8));
  }
  if (fresh) {
    std::operator+(&local_f0,dir,suffix);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,"/");
    std::__cxx11::string::~string((string *)&local_f0);
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_d0);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,(value_type *)local_d0);
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(dir);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
    }
    std::__cxx11::string::~string((string *)local_d0);
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos,
  const char* suffix, bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);
  if(pos != std::string::npos)
    {
    std::string cur_dir  = dir.substr(0,pos+3);

    // Follow "lib<suffix>".
    std::string next_dir = cur_dir + suffix;
    if(cmSystemTools::FileIsDirectory(next_dir))
      {
      next_dir += dir.substr(pos+3);
      std::string::size_type next_pos = pos+3+strlen(suffix)+1;
      this->AddArchitecturePath(next_dir, next_pos, suffix);
      }

    // Follow "lib".
    if(cmSystemTools::FileIsDirectory(cur_dir))
      {
      this->AddArchitecturePath(dir, pos+3+1, suffix, false);
      }
    }
  if(fresh)
    {
    // Check for <dir><suffix>/.
    std::string cur_dir  = dir + suffix + "/";
    if(cmSystemTools::FileIsDirectory(cur_dir))
      {
      this->SearchPaths.push_back(cur_dir);
      }

    // Now add the original unchanged path
    if(cmSystemTools::FileIsDirectory(dir))
      {
      this->SearchPaths.push_back(dir);
      }
    }
}